

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_model_rd_curvfit
               (BLOCK_SIZE bsize,double sse_norm,double xqr,double *rate_f,double *distbysse_f)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  double *in_RDX;
  double *in_RSI;
  byte in_DIL;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double *pdist;
  double *prate;
  double xo;
  int xi;
  double x;
  int dcat;
  int rcat;
  double epsilon;
  double x_step;
  double x_end;
  double x_start;
  double local_88;
  double local_80;
  
  bVar1 = ""[in_DIL];
  iVar2 = sse_norm_curvfit_model_cat_lookup(in_XMM0_Qa);
  local_80 = in_XMM1_Qa;
  if (in_XMM1_Qa <= -14.999999) {
    local_80 = -14.999999;
  }
  if (15.999999 <= local_80) {
    local_88 = 15.999999;
  }
  else {
    local_88 = local_80;
  }
  dVar4 = (local_88 - -15.5) / 0.5;
  dVar5 = floor(dVar4);
  iVar3 = (int)dVar5;
  dVar4 = dVar4 - (double)iVar3;
  dVar5 = interp_cubic(interp_rgrid_curv[(int)(uint)bVar1] + (iVar3 + -1),dVar4);
  *in_RSI = dVar5;
  dVar5 = interp_cubic(interp_dgrid_curv[iVar2] + (iVar3 + -1),dVar4);
  *in_RDX = dVar5;
  return;
}

Assistant:

void av1_model_rd_curvfit(BLOCK_SIZE bsize, double sse_norm, double xqr,
                          double *rate_f, double *distbysse_f) {
  const double x_start = -15.5;
  const double x_end = 16.5;
  const double x_step = 0.5;
  const double epsilon = 1e-6;
  const int rcat = bsize_curvfit_model_cat_lookup[bsize];
  const int dcat = sse_norm_curvfit_model_cat_lookup(sse_norm);
  (void)x_end;

  xqr = AOMMAX(xqr, x_start + x_step + epsilon);
  xqr = AOMMIN(xqr, x_end - x_step - epsilon);
  const double x = (xqr - x_start) / x_step;
  const int xi = (int)floor(x);
  const double xo = x - xi;

  assert(xi > 0);

  const double *prate = &interp_rgrid_curv[rcat][(xi - 1)];
  *rate_f = interp_cubic(prate, xo);
  const double *pdist = &interp_dgrid_curv[dcat][(xi - 1)];
  *distbysse_f = interp_cubic(pdist, xo);
}